

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,ConditionalStatement *stmt)

{
  bool bVar1;
  reference pCVar2;
  long in_RSI;
  Expression *in_RDI;
  type trueState;
  Condition *cond;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL> *__range3;
  DataFlowState falseState;
  DataFlowState *in_stack_fffffffffffffcf8;
  DataFlowState *other;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_fffffffffffffd00;
  DataFlowAnalysis *in_stack_fffffffffffffd08;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_fffffffffffffd18;
  DataFlowState *in_stack_fffffffffffffe20;
  DataFlowState *in_stack_fffffffffffffe28;
  DataFlowAnalysis *in_stack_fffffffffffffe30;
  undefined1 local_1a8 [48];
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffe88;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_fffffffffffffe90;
  __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
  local_c0;
  long local_b8;
  long local_10;
  
  local_10 = in_RSI;
  DataFlowAnalysis::unreachableState(in_stack_fffffffffffffd08);
  local_b8 = local_10 + 0x20;
  local_c0._M_current =
       (Condition *)
       std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL> *
                  )in_stack_fffffffffffffcf8);
  std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>::end
            ((span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL> *)
             in_stack_fffffffffffffd08);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffd00,
                       (__normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffcf8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
             ::operator*(&local_c0);
    not_null<const_slang::ast::Expression_*>::operator*
              ((not_null<const_slang::ast::Expression_*> *)0x823401);
    visitCondition(in_stack_fffffffffffffd18,in_RDI);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x82342e);
    if (pCVar2->pattern != (Pattern *)0x0) {
      visit<slang::ast::Pattern>(in_stack_fffffffffffffd00,(Pattern *)in_stack_fffffffffffffcf8);
    }
    DataFlowAnalysis::joinState
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    in_stack_fffffffffffffd00 =
         (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState> *)
         local_1a8;
    DataFlowState::DataFlowState
              ((DataFlowState *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    setState(in_stack_fffffffffffffe90,(DataFlowState *)in_stack_fffffffffffffe88.m_bits);
    DataFlowState::~DataFlowState((DataFlowState *)0x8234ca);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
    ::operator++(&local_c0);
  }
  visit<slang::ast::Statement>(in_stack_fffffffffffffd00,(Statement *)in_stack_fffffffffffffcf8);
  DataFlowState::DataFlowState((DataFlowState *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8)
  ;
  other = (DataFlowState *)&stack0xfffffffffffffd18;
  DataFlowState::DataFlowState((DataFlowState *)in_stack_fffffffffffffd00,other);
  setState(in_stack_fffffffffffffe90,(DataFlowState *)in_stack_fffffffffffffe88.m_bits);
  DataFlowState::~DataFlowState((DataFlowState *)0x823563);
  if (*(long *)(local_10 + 0x38) != 0) {
    visit<slang::ast::Statement>(in_stack_fffffffffffffd00,(Statement *)other);
  }
  DataFlowAnalysis::joinState
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  DataFlowState::~DataFlowState((DataFlowState *)0x8235ed);
  DataFlowState::~DataFlowState((DataFlowState *)0x8235fa);
  return;
}

Assistant:

void visitStmt(const ConditionalStatement& stmt) {
        auto falseState = (DERIVED).unreachableState();
        for (auto& cond : stmt.conditions) {
            visitCondition(*cond.expr);

            if (cond.pattern)
                visit(*cond.pattern);

            (DERIVED).joinState(falseState, stateWhenFalse);
            setState(std::move(stateWhenTrue));
        }

        visit(stmt.ifTrue);

        auto trueState = std::move(state);
        setState(std::move(falseState));
        if (stmt.ifFalse)
            visit(*stmt.ifFalse);

        (DERIVED).joinState(state, trueState);
    }